

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O1

int SaveHobeta(path *fname,char *fhobname,aint start,aint length)

{
  char cVar1;
  pointer pcVar2;
  byte bVar3;
  undefined2 uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  FILE *__s;
  int iVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  uint uVar13;
  char local_68 [10];
  undefined1 local_5e;
  char local_5d;
  char local_5c;
  undefined1 local_5b;
  byte local_5a;
  char local_59;
  undefined1 local_58;
  long *local_48 [2];
  long local_38 [2];
  
  pcVar12 = local_68;
  iVar5 = -1;
  if (length + start < 0x10001) {
    iVar5 = length;
  }
  iVar6 = 0x10000 - start;
  if (0 < iVar5) {
    iVar6 = iVar5;
  }
  builtin_strncpy(local_68,"         ",9);
  sVar7 = strlen(fhobname);
  iVar5 = (int)sVar7;
  if (1 < iVar5) {
    pcVar8 = strrchr(fhobname,0x2e);
    if ((pcVar8 != (char *)0x0) && (pcVar8[1] != '\0')) {
      iVar5 = (int)pcVar8 - (int)fhobname;
      local_68[8] = pcVar8[1];
    }
  }
  iVar9 = 8;
  if (iVar5 < 8) {
    iVar9 = iVar5;
  }
  memcpy(local_68,fhobname,(long)iVar9);
  uVar4 = (undefined2)start;
  if (local_68[8] == 'B') {
    uVar4 = (undefined2)iVar6;
  }
  local_68[9] = (char)uVar4;
  local_5e = (char)((ushort)uVar4 >> 8);
  local_5d = (char)iVar6;
  local_5c = (char)((uint)iVar6 >> 8);
  local_5b = 0;
  bVar3 = (local_5c + '\x01') - ((char)iVar6 == '\0');
  local_5a = bVar3;
  iVar6 = 1;
  iVar9 = 0;
  lVar10 = 0xf;
  iVar5 = 0;
  do {
    iVar11 = iVar5;
    cVar1 = *pcVar12;
    iVar5 = iVar9 + iVar11;
    pcVar12 = pcVar12 + 1;
    iVar6 = iVar6 + -1;
    iVar9 = iVar9 + 1;
    lVar10 = lVar10 + -1;
    iVar5 = iVar5 + (uint)CONCAT11(cVar1,cVar1);
  } while (lVar10 != 0);
  local_59 = ((char)iVar11 + cVar1) - (char)iVar6;
  local_58 = (undefined1)(((uint)CONCAT11(cVar1,cVar1) + iVar11) - iVar6 >> 8);
  __s = (FILE *)SJ_fopen(fname,"wb");
  if (__s == (FILE *)0x0) {
    pcVar2 = (fname->_M_pathname)._M_dataplus._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,pcVar2,pcVar2 + (fname->_M_pathname)._M_string_length);
    Error("opening file for write",(char *)local_48[0],FATAL);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  sVar7 = fwrite(local_68,1,0x11,__s);
  uVar13 = 0;
  if (sVar7 == 0x11) {
    iVar5 = SaveRAM((FILE *)__s,start,(uint)bVar3 << 8);
    uVar13 = (uint)(iVar5 != 0);
  }
  fclose(__s);
  return uVar13;
}

Assistant:

int SaveHobeta(const std::filesystem::path & fname, const char* fhobname, aint start, aint length) {
	unsigned char header[0x11];
	int i;

	if (length + start > 0x10000) {
		length = -1;
	}
	if (length <= 0) {
		length = 0x10000 - start;
	}

	memset(header,' ',9);
	i = strlen(fhobname);
	if (i > 1)
	{
		const char *ext = strrchr(fhobname, '.');
		if (ext && ext[1])
		{
			header[8] = ext[1];
			i = ext-fhobname;
		}
	}
	memcpy(header, fhobname, std::min(i,8));

	if (header[8] == 'B')	{
		header[0x09] = (unsigned char)(length & 0xff);
		header[0x0a] = (unsigned char)(length >> 8);
	} else	{
		header[0x09] = (unsigned char)(start & 0xff);
		header[0x0a] = (unsigned char)(start >> 8);
	}

	header[0x0b] = (unsigned char)(length & 0xff);
	header[0x0c] = (unsigned char)(length >> 8);
	header[0x0d] = 0;
	if (header[0x0b] == 0) {
		header[0x0e] = header[0x0c];
	} else {
		header[0x0e] = header[0x0c] + 1;
	}
	length = header[0x0e] * 0x100;
	int chk = 0;
	for (i = 0; i <= 14; chk = chk + (header[i] * 257) + i,i++) {
		;
	}
	header[0x0f] = (unsigned char)(chk & 0xff);
	header[0x10] = (unsigned char)(chk >> 8);

	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) {
		Error("opening file for write", fname.string().c_str(), FATAL);
	}

	int result = (17 == fwrite(header, 1, 17, ff)) && SaveRAM(ff, start, length);
	fclose(ff);
	return result;
}